

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int ARGBSobelToPlane(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_y,int dst_stride_y,int width
                    ,int height)

{
  uint uVar1;
  int iVar2;
  code *SobelRow;
  
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    SobelRow = SobelToPlaneRow_SSE2;
  }
  else {
    SobelRow = SobelToPlaneRow_Any_SSE2;
  }
  if ((uVar1 & 0x20) == 0) {
    SobelRow = SobelToPlaneRow_C;
  }
  iVar2 = libyuv::ARGBSobelize(src_argb,src_stride_argb,dst_y,dst_stride_y,width,height,SobelRow);
  return iVar2;
}

Assistant:

LIBYUV_API
int ARGBSobelToPlane(const uint8_t* src_argb,
                     int src_stride_argb,
                     uint8_t* dst_y,
                     int dst_stride_y,
                     int width,
                     int height) {
  void (*SobelToPlaneRow)(const uint8_t* src_sobelx, const uint8_t* src_sobely,
                          uint8_t* dst_, int width) = SobelToPlaneRow_C;
#if defined(HAS_SOBELTOPLANEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SobelToPlaneRow = SobelToPlaneRow_SSE2;
    }
  }
#endif
#if defined(HAS_SOBELTOPLANEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SobelToPlaneRow = SobelToPlaneRow_NEON;
    }
  }
#endif
#if defined(HAS_SOBELTOPLANEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SobelToPlaneRow = SobelToPlaneRow_MMI;
    }
  }
#endif
#if defined(HAS_SOBELTOPLANEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SobelToPlaneRow = SobelToPlaneRow_MSA;
    }
  }
#endif
  return ARGBSobelize(src_argb, src_stride_argb, dst_y, dst_stride_y, width,
                      height, SobelToPlaneRow);
}